

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p2pt.hxx
# Opt level: O0

void __thiscall
P2Pt::pose_poly<float>::find_bounded_root_intervals
          (pose_poly<float> *this,float (*root_ids_out) [1899])

{
  undefined8 uVar1;
  long in_RSI;
  pose_poly<float> *in_RDI;
  float fVar2;
  pose_poly<float> *unaff_retaddr;
  uint i;
  float next_val;
  float curr_val;
  undefined4 local_1c;
  undefined4 local_14;
  pose_poly<float> *ppVar3;
  
  ppVar3 = in_RDI;
  t_vec(in_RDI,0);
  local_14 = fn_t(unaff_retaddr,(float)((ulong)ppVar3 >> 0x20));
  for (local_1c = 0; local_1c < 0x76b; local_1c = local_1c + 1) {
    t_vec(in_RDI,local_1c + 1);
    fVar2 = fn_t(unaff_retaddr,(float)((ulong)ppVar3 >> 0x20));
    uVar1 = vcmpss_avx512f(ZEXT416((uint)(local_14 * fVar2)),(undefined1  [16])0x0,1);
    *(uint *)(in_RSI + (ulong)local_1c * 4) = (uint)((byte)uVar1 & 1) * 0x3f800000;
    local_14 = fVar2;
  }
  return;
}

Assistant:

inline void find_bounded_root_intervals(T (*root_ids_out)[ROOT_IDS_LEN]) {
    T curr_val = fn_t(t_vec(0)), next_val;
    for (unsigned i = 0; i < ROOT_IDS_LEN; i++) {
      next_val = fn_t(t_vec(i+1));
      (*root_ids_out)[i] = (curr_val * next_val) < 0;
      curr_val = next_val;
    }
  }